

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O0

int nn_timerset_event(nn_timerset *self,nn_timerset_hndl **hndl)

{
  int iVar1;
  nn_list_item *pnVar2;
  nn_list *pnVar3;
  undefined8 *in_RSI;
  nn_list *in_RDI;
  nn_timerset_hndl *first;
  nn_list_item *in_stack_ffffffffffffffc8;
  nn_list *self_00;
  nn_list_item *local_28;
  int local_4;
  
  iVar1 = nn_list_empty(in_RDI);
  if (iVar1 == 0) {
    pnVar2 = nn_list_begin(in_RDI);
    if (pnVar2 == (nn_list_item *)0x0) {
      local_28 = (nn_list_item *)0x0;
    }
    else {
      local_28 = nn_list_begin(in_RDI);
    }
    self_00 = (nn_list *)local_28[1].next;
    pnVar3 = (nn_list *)nn_clock_ms();
    if (pnVar3 < self_00) {
      local_4 = -0xb;
    }
    else {
      nn_list_erase(self_00,in_stack_ffffffffffffffc8);
      *in_RSI = local_28;
      local_4 = 0;
    }
  }
  else {
    local_4 = -0xb;
  }
  return local_4;
}

Assistant:

int nn_timerset_event (struct nn_timerset *self, struct nn_timerset_hndl **hndl)
{
    struct nn_timerset_hndl *first;

    /*  If there's no timeout, there's no event to report. */
    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -EAGAIN;

    /*  If no timeout have expired yet, there's no event to return. */
    first = nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list);
    if (first->timeout > nn_clock_ms())
        return -EAGAIN;

    /*  Return the first timeout and remove it from the list of active
        timeouts. */
    nn_list_erase (&self->timeouts, &first->list);
    *hndl = first;
    return 0;
}